

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::ReplaceStringInPlace
               (string *subject,char *search,int searchSize,char *replace,int replaceSize,
               size_t *firstReplacementIndex)

{
  bool bVar1;
  ulong uVar2;
  size_t pos;
  bool changed;
  size_t *firstReplacementIndex_local;
  int replaceSize_local;
  char *replace_local;
  int searchSize_local;
  char *search_local;
  string *subject_local;
  
  bVar1 = false;
  while (uVar2 = std::__cxx11::string::find((char *)subject,(ulong)search),
        uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)subject,uVar2,(char *)(long)searchSize);
    if (bVar1 == false) {
      bVar1 = true;
      *firstReplacementIndex = uVar2;
    }
  }
  return bVar1;
}

Assistant:

static bool ReplaceStringInPlace(
    std::string& subject,
    const char* search,
    int searchSize,
    const char* replace,
    int replaceSize,
    std::size_t& firstReplacementIndex)
{
    bool changed{false};
    std::size_t pos{0};
    while ((pos = subject.find(search, pos)) != std::string::npos) {
        subject.replace(pos, searchSize, replace);
        if (!changed) {
            changed = true;
            firstReplacementIndex = pos;
        }
        pos += replaceSize;
    }
    return changed;
}